

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O2

chunk_conflict * mtn_gen(player *p,wchar_t height,wchar_t width,char **p_error)

{
  int A;
  int A_00;
  loc grid;
  short sVar1;
  char *pcVar2;
  _Bool _Var3;
  uint32_t uVar4;
  uint32_t uVar5;
  wchar_t wVar6;
  int y;
  int x;
  wchar_t wVar7;
  chunk *c;
  feature *pfVar8;
  loc_conflict lVar9;
  loc_conflict lVar10;
  loc_conflict grid2;
  undefined8 uVar11;
  wchar_t wVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  uint local_1a4;
  int local_17c;
  wchar_t form_feats [7];
  loc_conflict stairs [3];
  loc_conflict pathpoints [20];
  wchar_t randpoints [20];
  
  wVar12 = (wchar_t)p->place;
  sVar1 = p->last_place;
  uVar11 = 2;
  local_1a4 = height / 2;
  form_feats[0] = FEAT_PASS_RUBBLE;
  form_feats[1] = FEAT_RUBBLE;
  form_feats[2] = FEAT_GRASS;
  form_feats[3] = FEAT_TREE;
  form_feats[4] = FEAT_TREE2;
  form_feats[5] = FEAT_ROAD;
  form_feats[6] = FEAT_NONE;
  c = (chunk *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  c->depth = (int)p->depth;
  c->place = wVar12;
  lVar15 = 0;
  for (lVar17 = 0; wVar6 = (wchar_t)uVar11, lVar17 < c->height; lVar17 = lVar17 + 1) {
    for (lVar18 = 0; lVar18 < c->width; lVar18 = lVar18 + 1) {
      square_set_feat((chunk_conflict *)c,(loc)(lVar15 + lVar18),FEAT_GRASS);
    }
    lVar15 = lVar15 + 0x100000000;
  }
  set_num_vaults((chunk_conflict *)c);
  lVar17 = 0;
  make_edges((chunk_conflict *)c,false,false);
  alloc_paths((chunk_conflict *)c,(player *)(ulong)(uint)wVar12,(int)sVar1,wVar6);
  for (lVar15 = 0; lVar15 < c->height; lVar15 = lVar15 + 1) {
    for (lVar18 = 0; lVar18 < c->width; lVar18 = lVar18 + 1) {
      pfVar8 = square_feat((chunk_conflict *)c,(loc)(lVar18 + lVar17));
      if (pfVar8->fidx == FEAT_GRASS) {
        square_set_feat((chunk_conflict *)c,(loc)(lVar18 + lVar17),FEAT_GRANITE);
      }
    }
    lVar17 = lVar17 + 0x100000000;
  }
  uVar16 = (long)width / 2 & 0xffffffff;
  pcVar2 = world->levels[wVar12].down;
  if (pcVar2 != (char *)0x0) {
    iVar13 = 3;
    while (iVar13 != 0) {
      uVar4 = Rand_div(c->height + L'\xfffffffe');
      uVar5 = Rand_div(c->width + L'\xfffffffe');
      grid.y = uVar4 + L'\x01';
      grid.x = uVar5 + L'\x01';
      pfVar8 = square_feat((chunk_conflict *)c,grid);
      if ((pfVar8->fidx == FEAT_ROAD) ||
         (pfVar8 = square_feat((chunk_conflict *)c,grid), pfVar8->fidx == FEAT_GRASS)) {
        square_set_feat((chunk_conflict *)c,grid,FEAT_MORE);
        square_mark((chunk_conflict *)c,grid);
        stairs[3 - iVar13].x = uVar5 + L'\x01';
        stairs[3 - iVar13].y = uVar4 + L'\x01';
        iVar13 = iVar13 + -1;
        if (iVar13 == 0) {
          wVar12 = level_topography((int)sVar1);
          iVar13 = 0;
          if (wVar12 == L'\a') {
            player_place((chunk_conflict2 *)c,p,grid);
          }
        }
      }
    }
  }
  lVar17 = 0;
  wVar12 = L'\0';
  for (lVar15 = 0; lVar15 < c->height; lVar15 = lVar15 + 1) {
    for (lVar18 = 0; lVar18 < c->width; lVar18 = lVar18 + 1) {
      pfVar8 = square_feat((chunk_conflict *)c,(loc)(lVar17 + lVar18));
      if (pfVar8->fidx == FEAT_ROAD) {
        square_mark((chunk_conflict *)c,(loc)(lVar17 + lVar18));
        wVar12 = wVar12 + L'\x01';
      }
    }
    lVar17 = lVar17 + 0x100000000;
  }
  for (lVar15 = 0; lVar15 != 0x14; lVar15 = lVar15 + 1) {
    wVar6 = Rand_div(wVar12);
    randpoints[lVar15] = wVar6;
  }
  for (lVar15 = 0; lVar15 < c->height; lVar15 = lVar15 + 1) {
    for (uVar14 = 0; (long)uVar14 < (long)c->width; uVar14 = uVar14 + 1) {
      pfVar8 = square_feat((chunk_conflict *)c,(loc)(lVar15 << 0x20 | uVar14));
      if (pfVar8->fidx == FEAT_ROAD) {
        wVar12 = wVar12 + L'\xffffffff';
        for (lVar17 = 0; lVar17 != 0x14; lVar17 = lVar17 + 1) {
          if (wVar12 == randpoints[lVar17]) {
            pathpoints[lVar17].x = (int)uVar14;
            pathpoints[lVar17].y = (int)lVar15;
          }
        }
      }
    }
  }
  if (pcVar2 != (char *)0x0) {
    for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
      wVar12 = c->height + c->width;
      lVar9 = stairs[lVar15];
      for (lVar17 = 0; lVar17 != 0x14; lVar17 = lVar17 + 1) {
        lVar10 = pathpoints[lVar17];
        wVar6 = distance(lVar9,lVar10);
        if (wVar6 < wVar12) {
          local_1a4 = lVar10.x;
        }
        if (wVar6 < wVar12) {
          wVar12 = wVar6;
          uVar16 = (ulong)lVar10 >> 0x20;
        }
      }
      mtn_connect((chunk_conflict *)c,lVar9,(loc_conflict)((ulong)local_1a4 | uVar16 << 0x20));
    }
  }
  local_17c = rand_range(2,4);
  for (iVar13 = 0; iVar13 != 0x32; iVar13 = iVar13 + 1) {
    uVar4 = Rand_div(6);
    A = uVar4 + 4;
    uVar5 = Rand_div(5);
    A_00 = uVar5 + 4;
    y = rand_range(A_00,(c->height - uVar5) + -5);
    x = rand_range(A,(c->width - uVar4) + -5);
    lVar9 = loc(x,y);
    lVar10 = loc(-4 - uVar4,-4 - uVar5);
    lVar9 = loc_sum(lVar9,lVar10);
    lVar10 = loc(x,y);
    grid2 = loc(A,A_00);
    lVar10 = loc_sum(lVar10,grid2);
    _Var3 = check_clearing_space((chunk_conflict *)c,lVar9,lVar10);
    if (_Var3) {
      _Var3 = generate_starburst_room(c,y - A_00,x - A,A_00 + y,A + x,false,FEAT_GRASS,true);
      if (_Var3) {
        lVar9 = loc(x,y);
        wVar12 = c->height + c->width;
        for (lVar15 = 0; lVar15 != 0x14; lVar15 = lVar15 + 1) {
          lVar10 = pathpoints[lVar15];
          wVar6 = distance(lVar9,lVar10);
          if (wVar6 < wVar12) {
            local_1a4 = lVar10.x;
          }
          if (wVar6 < wVar12) {
            wVar12 = wVar6;
            uVar16 = (ulong)lVar10 >> 0x20;
          }
        }
        mtn_connect((chunk_conflict *)c,lVar9,(loc_conflict)((ulong)local_1a4 | uVar16 << 0x20));
        local_17c = local_17c + -1;
        if (local_17c == 0) break;
      }
    }
  }
  for (iVar13 = 0; iVar13 < c->depth * 0x32; iVar13 = iVar13 + wVar6) {
    uVar4 = Rand_div(c->height + L'\xfffffffe');
    uVar5 = Rand_div(c->width + L'\xfffffffe');
    lVar9.x = uVar5 + 1;
    lVar9.y = uVar4 + 1;
    wVar6 = make_formation((chunk_conflict *)c,p,lVar9,FEAT_GRANITE,FEAT_GRANITE,form_feats,
                           "Mountain",c->depth * 2);
    wVar12 = c->height + c->width;
    for (lVar15 = 0; lVar15 != 0x14; lVar15 = lVar15 + 1) {
      lVar10 = pathpoints[lVar15];
      wVar7 = distance(lVar9,lVar10);
      if (wVar7 < wVar12) {
        local_1a4 = lVar10.x;
      }
      if (wVar7 < wVar12) {
        wVar12 = wVar7;
        uVar16 = (ulong)lVar10 >> 0x20;
      }
    }
    mtn_connect((chunk_conflict *)c,lVar9,(loc_conflict)((ulong)local_1a4 | uVar16 << 0x20));
  }
  lVar15 = 0;
  for (lVar17 = 0; lVar17 < c->height; lVar17 = lVar17 + 1) {
    for (lVar18 = 0; lVar18 < c->width; lVar18 = lVar18 + 1) {
      square_unmark((chunk_conflict *)c,(loc)(lVar15 + lVar18));
    }
    lVar15 = lVar15 + 0x100000000;
  }
  ensure_connectedness(c,false);
  populate((chunk_conflict *)c,false);
  _Var3 = verify_level((chunk_conflict *)c);
  if (!_Var3) {
    wipe_mon_list(c,p);
    cave_free((chunk_conflict *)c);
    *p_error = "wilderness level had generation issues";
    c = (chunk *)0x0;
  }
  return (chunk_conflict *)c;
}

Assistant:

struct chunk *mtn_gen(struct player *p, int height, int width,
					  const char **p_error)
{
	struct loc grid;
	int i, j;
	int plats;
	int place = p->place;
	int last_place = p->last_place;
	int form_grids = 0;
	int min, dist, floors = 0;
	int randpoints[20];
	struct loc pathpoints[20];
	struct loc nearest_point = { height / 2, width / 2 };
	struct loc stairs[3];

	int form_feats[] = { FEAT_PASS_RUBBLE, FEAT_RUBBLE, FEAT_GRASS,
						 FEAT_TREE, FEAT_TREE2, FEAT_ROAD, FEAT_NONE };

	bool amon_rudh = false;

	/* Make the level */
	struct chunk *c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = place;

	/* Start with grass (lets paths work -NRM-) */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			/* Create grass */
			square_set_feat(c, grid, FEAT_GRASS);
		}
	}

	/* Set the number of wilderness vaults */
	set_num_vaults(c);

	/* Make place boundaries */
	make_edges(c, false, false);

	/* Place 2 or 3 paths to neighbouring places, make the paths through the
	 * place, place the player -NRM- */
	alloc_paths(c, p, place, last_place);

	/* Turn grass to granite */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			if (square_feat(c, grid)->fidx == FEAT_GRASS) {
				square_set_feat(c, grid, FEAT_GRANITE);
			}
		}
	}

	/* Dungeon entrance */
	if (world->levels[place].down) {
		/* Set the flag */
		amon_rudh = true;

		/* Mim's cave on Amon Rudh */
		i = 3;
		while (i) {
			grid.y = randint0(c->height - 2) + 1;
			grid.x = randint0(c->width - 2) + 1;
			if ((square_feat(c, grid)->fidx == FEAT_ROAD) ||
				(square_feat(c, grid)->fidx == FEAT_GRASS)) {
				square_set_feat(c, grid, FEAT_MORE);
				square_mark(c, grid);
				i--;
				stairs[2 - i] = grid;
				if (!i && (level_topography(last_place) == TOP_CAVE))
					player_place(c, p, grid);
			}
		}
	}


	/* Make paths permanent */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			if (square_feat(c, grid)->fidx == FEAT_ROAD) {
				/* Hack - prepare for plateaux, connecting */
				square_mark(c, grid);
				floors++;
			}
		}
	}

	/* Pick some joining points */
	for (j = 0; j < 20; j++)
		randpoints[j] = randint0(floors);
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			if (square_feat(c, grid)->fidx == FEAT_ROAD)
				floors--;
			else
				continue;
			for (j = 0; j < 20; j++) {
				if (floors == randpoints[j]) {
					pathpoints[j] = grid;
				}
			}
		}
	}

	/* Find the staircases, if any */
	if (amon_rudh) {
		for (j = 0; j < 3; j++) {
			grid = stairs[j];

			/* Now join them up */
			min = c->width + c->height;
			for (i = 0; i < 20; i++) {
				dist = distance(grid, pathpoints[i]);
				if (dist < min) {
					min = dist;
					nearest_point = pathpoints[i];
				}
			}
			mtn_connect(c, grid, nearest_point);
		}
	}

	/* Make a few "plateaux" */
	plats = rand_range(2, 4);

	/* Try fairly hard */
	for (j = 0; j < 50; j++) {
		int a, b, x, y;

		/* Try for a plateau */
		a = randint0(6) + 4;
		b = randint0(5) + 4;
		y = rand_range(b, c->height - 1 - b);
		x = rand_range(a, c->width - 1 - a);
		if (!check_clearing_space(c, loc_sum(loc(x, y), loc(-a, -b)),
				loc_sum(loc(x, y), loc(a, b)))
				|| !generate_starburst_room(c, y - b, x - a,
				y + b, x + a, false, FEAT_GRASS, true)) continue;

		/* Success */
		grid = loc(x, y);
		plats--;

		/* Now join it up */
		min = c->width + c->height;
		for (i = 0; i < 20; i++) {
			dist = distance(grid, pathpoints[i]);
			if (dist < min) {
				min = dist;
				nearest_point = pathpoints[i];
			}
		}
		mtn_connect(c, grid, nearest_point);

		/* Done ? */
		if (!plats)
			break;
	}

	/* Make a few formations */
	while (form_grids < 50 * (c->depth)) {
		/* Choose a place */
		grid.y = randint1(c->height - 2);
		grid.x = randint1(c->width - 2);
		form_grids += make_formation(c, p, grid, FEAT_GRANITE, FEAT_GRANITE,
									 form_feats, "Mountain", c->depth * 2);
		/* Now join it up */
		min = c->width + c->height;
		for (i = 0; i < 20; i++) {
			dist = distance(grid, pathpoints[i]);
			if (dist < min) {
				min = dist;
				nearest_point = pathpoints[i];
			}
		}
		mtn_connect(c, grid, nearest_point);

	}

	/* Unmark squares */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			square_unmark(c, grid);
		}
	}
	ensure_connectedness(c, false);

	/* Place objects, traps and monsters */
	(void) populate(c, false);

	if (!verify_level(c)) {
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "wilderness level had generation issues";
		return NULL;
	}

	return c;
}